

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.c
# Opt level: O0

void sga_unpack(Integer first,long lim,Integer elems,Integer type_src,Integer type_msk,void *ptr_src
               ,void *ptr_dst,void *ptr_msk)

{
  long in_RCX;
  long in_RDX;
  long in_RSI;
  DoubleComplex *in_RDI;
  long in_R8;
  long in_R9;
  double *pck_46;
  DoubleComplex *msk_45;
  float *dst_45;
  float *pck_45;
  DoubleComplex *msk_44;
  longlong *dst_44;
  longlong *pck_44;
  DoubleComplex *msk_43;
  long *dst_43;
  long *pck_43;
  DoubleComplex *msk_42;
  int *dst_42;
  int *pck_42;
  SingleComplex *msk_41;
  DoubleComplex *dst_41;
  DoubleComplex *pck_41;
  SingleComplex *msk_40;
  SingleComplex *dst_40;
  SingleComplex *pck_40;
  SingleComplex *msk_39;
  double *dst_39;
  double *pck_39;
  SingleComplex *msk_38;
  float *dst_38;
  float *pck_38;
  SingleComplex *msk_37;
  longlong *dst_37;
  longlong *pck_37;
  SingleComplex *msk_36;
  long *dst_36;
  long *pck_36;
  SingleComplex *msk_35;
  int *dst_35;
  int *pck_35;
  double *msk_34;
  DoubleComplex *dst_34;
  DoubleComplex *pck_34;
  double *msk_33;
  SingleComplex *dst_33;
  SingleComplex *pck_33;
  double *msk_32;
  double *dst_32;
  double *pck_32;
  double *msk_31;
  float *dst_31;
  float *pck_31;
  double *msk_30;
  longlong *dst_30;
  longlong *pck_30;
  double *msk_29;
  long *dst_29;
  long *pck_29;
  double *msk_28;
  int *dst_28;
  int *pck_28;
  float *msk_27;
  DoubleComplex *dst_27;
  DoubleComplex *pck_27;
  float *msk_26;
  SingleComplex *dst_26;
  SingleComplex *pck_26;
  float *msk_25;
  double *dst_25;
  double *pck_25;
  float *msk_24;
  float *dst_24;
  float *pck_24;
  float *msk_23;
  longlong *dst_23;
  longlong *pck_23;
  float *msk_22;
  long *dst_22;
  long *pck_22;
  float *msk_21;
  int *dst_21;
  int *pck_21;
  longlong *msk_20;
  DoubleComplex *dst_20;
  DoubleComplex *pck_20;
  longlong *msk_19;
  SingleComplex *dst_19;
  SingleComplex *pck_19;
  longlong *msk_18;
  double *dst_18;
  double *pck_18;
  longlong *msk_17;
  float *dst_17;
  float *pck_17;
  longlong *msk_16;
  longlong *dst_16;
  longlong *pck_16;
  longlong *msk_15;
  long *dst_15;
  long *pck_15;
  longlong *msk_14;
  int *dst_14;
  int *pck_14;
  long *msk_13;
  DoubleComplex *dst_13;
  DoubleComplex *pck_13;
  long *msk_12;
  SingleComplex *dst_12;
  SingleComplex *pck_12;
  long *msk_11;
  double *dst_11;
  double *pck_11;
  long *msk_10;
  float *dst_10;
  float *pck_10;
  long *msk_9;
  longlong *dst_9;
  longlong *pck_9;
  long *msk_8;
  long *dst_8;
  long *pck_8;
  long *msk_7;
  int *dst_7;
  int *pck_7;
  int *msk_6;
  DoubleComplex *dst_6;
  DoubleComplex *pck_6;
  int *msk_5;
  SingleComplex *dst_5;
  SingleComplex *pck_5;
  int *msk_4;
  double *dst_4;
  double *pck_4;
  int *msk_3;
  float *dst_3;
  float *pck_3;
  int *msk_2;
  longlong *dst_2;
  longlong *pck_2;
  int *msk_1;
  long *dst_1;
  long *pck_1;
  int *msk;
  int *dst;
  int *pck;
  Integer pck_idx;
  Integer i;
  Integer combined_type;
  long local_48;
  DoubleComplex *msk_48;
  DoubleComplex *dst_48;
  DoubleComplex *pck_48;
  DoubleComplex *msk_47;
  SingleComplex *dst_47;
  SingleComplex *pck_47;
  DoubleComplex *msk_46;
  double *dst_46;
  
  local_48 = 0;
  msk_48 = in_RDI;
  switch(in_RCX * 0x11 + in_R8) {
  case 0x4662:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (dst_45[(long)msk_48] != 0.0) {
        *(undefined4 *)((long)&msk_45->real + (long)msk_48 * 4) =
             *(undefined4 *)(in_R9 + local_48 * 4);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4663:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (*(long *)(dst_45 + (long)msk_48 * 2) != 0) {
        *(undefined4 *)((long)&msk_45->real + (long)msk_48 * 4) =
             *(undefined4 *)(in_R9 + local_48 * 4);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4664:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if ((dst_45[(long)msk_48] != 0.0) || (NAN(dst_45[(long)msk_48]))) {
        *(undefined4 *)((long)&msk_45->real + (long)msk_48 * 4) =
             *(undefined4 *)(in_R9 + local_48 * 4);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4665:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if ((*(double *)(dst_45 + (long)msk_48 * 2) != 0.0) ||
         (NAN(*(double *)(dst_45 + (long)msk_48 * 2)))) {
        *(undefined4 *)((long)&msk_45->real + (long)msk_48 * 4) =
             *(undefined4 *)(in_R9 + local_48 * 4);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4667:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (((dst_45[(long)msk_48 * 2] != 0.0) || (NAN(dst_45[(long)msk_48 * 2]))) ||
         ((dst_45[(long)msk_48 * 2 + 1] != 0.0 || (NAN(dst_45[(long)msk_48 * 2 + 1]))))) {
        *(undefined4 *)((long)&msk_45->real + (long)msk_48 * 4) =
             *(undefined4 *)(in_R9 + local_48 * 4);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4668:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if ((((*(double *)(dst_45 + (long)msk_48 * 4) != 0.0) ||
           (NAN(*(double *)(dst_45 + (long)msk_48 * 4)))) ||
          (*(double *)(dst_45 + (long)msk_48 * 4 + 2) != 0.0)) ||
         (NAN(*(double *)(dst_45 + (long)msk_48 * 4 + 2)))) {
        *(undefined4 *)((long)&msk_45->real + (long)msk_48 * 4) =
             *(undefined4 *)(in_R9 + local_48 * 4);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4671:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (*(long *)(dst_45 + (long)msk_48 * 2) != 0) {
        *(undefined4 *)((long)&msk_45->real + (long)msk_48 * 4) =
             *(undefined4 *)(in_R9 + local_48 * 4);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4673:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (dst_45[(long)msk_48] != 0.0) {
        (&msk_45->real)[(long)msk_48] = *(DoublePrecision *)(in_R9 + local_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4674:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (*(long *)(dst_45 + (long)msk_48 * 2) != 0) {
        (&msk_45->real)[(long)msk_48] = *(DoublePrecision *)(in_R9 + local_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4675:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if ((dst_45[(long)msk_48] != 0.0) || (NAN(dst_45[(long)msk_48]))) {
        (&msk_45->real)[(long)msk_48] = *(DoublePrecision *)(in_R9 + local_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4676:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if ((*(double *)(dst_45 + (long)msk_48 * 2) != 0.0) ||
         (NAN(*(double *)(dst_45 + (long)msk_48 * 2)))) {
        (&msk_45->real)[(long)msk_48] = *(DoublePrecision *)(in_R9 + local_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4678:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (((dst_45[(long)msk_48 * 2] != 0.0) || (NAN(dst_45[(long)msk_48 * 2]))) ||
         ((dst_45[(long)msk_48 * 2 + 1] != 0.0 || (NAN(dst_45[(long)msk_48 * 2 + 1]))))) {
        (&msk_45->real)[(long)msk_48] = *(DoublePrecision *)(in_R9 + local_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4679:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if ((((*(double *)(dst_45 + (long)msk_48 * 4) != 0.0) ||
           (NAN(*(double *)(dst_45 + (long)msk_48 * 4)))) ||
          (*(double *)(dst_45 + (long)msk_48 * 4 + 2) != 0.0)) ||
         (NAN(*(double *)(dst_45 + (long)msk_48 * 4 + 2)))) {
        (&msk_45->real)[(long)msk_48] = *(DoublePrecision *)(in_R9 + local_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4682:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (*(long *)(dst_45 + (long)msk_48 * 2) != 0) {
        (&msk_45->real)[(long)msk_48] = *(DoublePrecision *)(in_R9 + local_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4684:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (dst_45[(long)msk_48] != 0.0) {
        *(undefined4 *)((long)&msk_45->real + (long)msk_48 * 4) =
             *(undefined4 *)(in_R9 + local_48 * 4);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4685:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (*(long *)(dst_45 + (long)msk_48 * 2) != 0) {
        *(undefined4 *)((long)&msk_45->real + (long)msk_48 * 4) =
             *(undefined4 *)(in_R9 + local_48 * 4);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4686:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if ((dst_45[(long)msk_48] != 0.0) || (NAN(dst_45[(long)msk_48]))) {
        *(undefined4 *)((long)&msk_45->real + (long)msk_48 * 4) =
             *(undefined4 *)(in_R9 + local_48 * 4);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4687:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if ((*(double *)(dst_45 + (long)msk_48 * 2) != 0.0) ||
         (NAN(*(double *)(dst_45 + (long)msk_48 * 2)))) {
        *(undefined4 *)((long)&msk_45->real + (long)msk_48 * 4) =
             *(undefined4 *)(in_R9 + local_48 * 4);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4689:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (((dst_45[(long)msk_48 * 2] != 0.0) || (NAN(dst_45[(long)msk_48 * 2]))) ||
         ((dst_45[(long)msk_48 * 2 + 1] != 0.0 || (NAN(dst_45[(long)msk_48 * 2 + 1]))))) {
        *(undefined4 *)((long)&msk_45->real + (long)msk_48 * 4) =
             *(undefined4 *)(in_R9 + local_48 * 4);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x468a:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if ((((*(double *)(dst_45 + (long)msk_48 * 4) != 0.0) ||
           (NAN(*(double *)(dst_45 + (long)msk_48 * 4)))) ||
          (*(double *)(dst_45 + (long)msk_48 * 4 + 2) != 0.0)) ||
         (NAN(*(double *)(dst_45 + (long)msk_48 * 4 + 2)))) {
        *(undefined4 *)((long)&msk_45->real + (long)msk_48 * 4) =
             *(undefined4 *)(in_R9 + local_48 * 4);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4693:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (*(long *)(dst_45 + (long)msk_48 * 2) != 0) {
        *(undefined4 *)((long)&msk_45->real + (long)msk_48 * 4) =
             *(undefined4 *)(in_R9 + local_48 * 4);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4695:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (dst_45[(long)msk_48] != 0.0) {
        (&msk_45->real)[(long)msk_48] = *(DoublePrecision *)(in_R9 + local_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4696:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (*(long *)(dst_45 + (long)msk_48 * 2) != 0) {
        (&msk_45->real)[(long)msk_48] = *(DoublePrecision *)(in_R9 + local_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4697:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if ((dst_45[(long)msk_48] != 0.0) || (NAN(dst_45[(long)msk_48]))) {
        (&msk_45->real)[(long)msk_48] = *(DoublePrecision *)(in_R9 + local_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4698:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if ((*(double *)(dst_45 + (long)msk_48 * 2) != 0.0) ||
         (NAN(*(double *)(dst_45 + (long)msk_48 * 2)))) {
        (&msk_45->real)[(long)msk_48] = *(DoublePrecision *)(in_R9 + local_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x469a:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (((dst_45[(long)msk_48 * 2] != 0.0) || (NAN(dst_45[(long)msk_48 * 2]))) ||
         ((dst_45[(long)msk_48 * 2 + 1] != 0.0 || (NAN(dst_45[(long)msk_48 * 2 + 1]))))) {
        (&msk_45->real)[(long)msk_48] = *(DoublePrecision *)(in_R9 + local_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x469b:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if ((((*(double *)(dst_45 + (long)msk_48 * 4) != 0.0) ||
           (NAN(*(double *)(dst_45 + (long)msk_48 * 4)))) ||
          (*(double *)(dst_45 + (long)msk_48 * 4 + 2) != 0.0)) ||
         (NAN(*(double *)(dst_45 + (long)msk_48 * 4 + 2)))) {
        (&msk_45->real)[(long)msk_48] = *(DoublePrecision *)(in_R9 + local_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x46a4:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (*(long *)(dst_45 + (long)msk_48 * 2) != 0) {
        (&msk_45->real)[(long)msk_48] = *(DoublePrecision *)(in_R9 + local_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x46b7:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (dst_45[(long)msk_48] != 0.0) {
        *(undefined4 *)(&msk_45->real + (long)msk_48) = *(undefined4 *)(in_R9 + local_48 * 8);
        *(undefined4 *)((long)&msk_45->real + (long)msk_48 * 8 + 4) =
             *(undefined4 *)(in_R9 + 4 + local_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x46b8:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (*(long *)(dst_45 + (long)msk_48 * 2) != 0) {
        *(undefined4 *)(&msk_45->real + (long)msk_48) = *(undefined4 *)(in_R9 + local_48 * 8);
        *(undefined4 *)((long)&msk_45->real + (long)msk_48 * 8 + 4) =
             *(undefined4 *)(in_R9 + 4 + local_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x46b9:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if ((dst_45[(long)msk_48] != 0.0) || (NAN(dst_45[(long)msk_48]))) {
        *(undefined4 *)(&msk_45->real + (long)msk_48) = *(undefined4 *)(in_R9 + local_48 * 8);
        *(undefined4 *)((long)&msk_45->real + (long)msk_48 * 8 + 4) =
             *(undefined4 *)(in_R9 + 4 + local_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x46ba:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if ((*(double *)(dst_45 + (long)msk_48 * 2) != 0.0) ||
         (NAN(*(double *)(dst_45 + (long)msk_48 * 2)))) {
        *(undefined4 *)(&msk_45->real + (long)msk_48) = *(undefined4 *)(in_R9 + local_48 * 8);
        *(undefined4 *)((long)&msk_45->real + (long)msk_48 * 8 + 4) =
             *(undefined4 *)(in_R9 + 4 + local_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x46bc:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (((dst_45[(long)msk_48 * 2] != 0.0) || (NAN(dst_45[(long)msk_48 * 2]))) ||
         ((dst_45[(long)msk_48 * 2 + 1] != 0.0 || (NAN(dst_45[(long)msk_48 * 2 + 1]))))) {
        *(undefined4 *)(&msk_45->real + (long)msk_48) = *(undefined4 *)(in_R9 + local_48 * 8);
        *(undefined4 *)((long)&msk_45->real + (long)msk_48 * 8 + 4) =
             *(undefined4 *)(in_R9 + 4 + local_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x46bd:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if ((((*(double *)(dst_45 + (long)msk_48 * 4) != 0.0) ||
           (NAN(*(double *)(dst_45 + (long)msk_48 * 4)))) ||
          (*(double *)(dst_45 + (long)msk_48 * 4 + 2) != 0.0)) ||
         (NAN(*(double *)(dst_45 + (long)msk_48 * 4 + 2)))) {
        *(undefined4 *)(&msk_45->real + (long)msk_48) = *(undefined4 *)(in_R9 + local_48 * 8);
        *(undefined4 *)((long)&msk_45->real + (long)msk_48 * 8 + 4) =
             *(undefined4 *)(in_R9 + 4 + local_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x46c6:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (*(long *)(dst_45 + (long)msk_48 * 2) != 0) {
        *(undefined4 *)(&msk_45->real + (long)msk_48) = *(undefined4 *)(in_R9 + local_48 * 8);
        *(undefined4 *)((long)&msk_45->real + (long)msk_48 * 8 + 4) =
             *(undefined4 *)(in_R9 + 4 + local_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x46c8:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (dst_45[(long)msk_48] != 0.0) {
        msk_45[(long)msk_48].real = *(DoublePrecision *)(in_R9 + local_48 * 0x10);
        msk_45[(long)msk_48].imag = *(DoublePrecision *)(in_R9 + local_48 * 0x10 + 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x46c9:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (*(long *)(dst_45 + (long)msk_48 * 2) != 0) {
        msk_45[(long)msk_48].real = *(DoublePrecision *)(in_R9 + local_48 * 0x10);
        msk_45[(long)msk_48].imag = *(DoublePrecision *)(in_R9 + local_48 * 0x10 + 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x46ca:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if ((dst_45[(long)msk_48] != 0.0) || (NAN(dst_45[(long)msk_48]))) {
        msk_45[(long)msk_48].real = *(DoublePrecision *)(in_R9 + local_48 * 0x10);
        msk_45[(long)msk_48].imag = *(DoublePrecision *)(in_R9 + local_48 * 0x10 + 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x46cb:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if ((*(double *)(dst_45 + (long)msk_48 * 2) != 0.0) ||
         (NAN(*(double *)(dst_45 + (long)msk_48 * 2)))) {
        msk_45[(long)msk_48].real = *(DoublePrecision *)(in_R9 + local_48 * 0x10);
        msk_45[(long)msk_48].imag = *(DoublePrecision *)(in_R9 + local_48 * 0x10 + 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x46cd:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (((dst_45[(long)msk_48 * 2] != 0.0) || (NAN(dst_45[(long)msk_48 * 2]))) ||
         ((dst_45[(long)msk_48 * 2 + 1] != 0.0 || (NAN(dst_45[(long)msk_48 * 2 + 1]))))) {
        msk_45[(long)msk_48].real = *(DoublePrecision *)(in_R9 + local_48 * 0x10);
        msk_45[(long)msk_48].imag = *(DoublePrecision *)(in_R9 + local_48 * 0x10 + 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x46ce:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if ((((*(double *)(dst_45 + (long)msk_48 * 4) != 0.0) ||
           (NAN(*(double *)(dst_45 + (long)msk_48 * 4)))) ||
          (*(double *)(dst_45 + (long)msk_48 * 4 + 2) != 0.0)) ||
         (NAN(*(double *)(dst_45 + (long)msk_48 * 4 + 2)))) {
        msk_45[(long)msk_48].real = *(DoublePrecision *)(in_R9 + local_48 * 0x10);
        msk_45[(long)msk_48].imag = *(DoublePrecision *)(in_R9 + local_48 * 0x10 + 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x46d7:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (*(long *)(dst_45 + (long)msk_48 * 2) != 0) {
        msk_45[(long)msk_48].real = *(DoublePrecision *)(in_R9 + local_48 * 0x10);
        msk_45[(long)msk_48].imag = *(DoublePrecision *)(in_R9 + local_48 * 0x10 + 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4761:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (dst_45[(long)msk_48] != 0.0) {
        (&msk_45->real)[(long)msk_48] = *(DoublePrecision *)(in_R9 + local_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4762:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (*(long *)(dst_45 + (long)msk_48 * 2) != 0) {
        (&msk_45->real)[(long)msk_48] = *(DoublePrecision *)(in_R9 + local_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4763:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if ((dst_45[(long)msk_48] != 0.0) || (NAN(dst_45[(long)msk_48]))) {
        (&msk_45->real)[(long)msk_48] = *(DoublePrecision *)(in_R9 + local_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4764:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if ((*(double *)(dst_45 + (long)msk_48 * 2) != 0.0) ||
         (NAN(*(double *)(dst_45 + (long)msk_48 * 2)))) {
        (&msk_45->real)[(long)msk_48] = *(DoublePrecision *)(in_R9 + local_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4766:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (((dst_45[(long)msk_48 * 2] != 0.0) || (NAN(dst_45[(long)msk_48 * 2]))) ||
         ((dst_45[(long)msk_48 * 2 + 1] != 0.0 || (NAN(dst_45[(long)msk_48 * 2 + 1]))))) {
        (&msk_45->real)[(long)msk_48] = *(DoublePrecision *)(in_R9 + local_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4767:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if ((((*(double *)(dst_45 + (long)msk_48 * 4) != 0.0) ||
           (NAN(*(double *)(dst_45 + (long)msk_48 * 4)))) ||
          (*(double *)(dst_45 + (long)msk_48 * 4 + 2) != 0.0)) ||
         (NAN(*(double *)(dst_45 + (long)msk_48 * 4 + 2)))) {
        (&msk_45->real)[(long)msk_48] = *(DoublePrecision *)(in_R9 + local_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4770:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (*(long *)(dst_45 + (long)msk_48 * 2) != 0) {
        (&msk_45->real)[(long)msk_48] = *(DoublePrecision *)(in_R9 + local_48 * 8);
        local_48 = local_48 + 1;
      }
    }
  }
  return;
}

Assistant:

static void sga_unpack(Integer first, long lim, Integer elems,
                       Integer type_src, Integer type_msk,
                       void *ptr_src, void *ptr_dst, void *ptr_msk)
{
    Integer combined_type, i, pck_idx=0;
    combined_type = MT_NUMTYPES*type_src + type_msk;
    switch (combined_type) {
#define ga_unpack_case(MT,T,AT,MT_MSK,T_MSK,AT_MSK)                     \
        case (MT_NUMTYPES*MT) + MT_MSK:                                 \
            {                                                           \
                T * restrict pck = (T*)ptr_src;                         \
                T * restrict dst = (T*)ptr_dst;                         \
                T_MSK * restrict msk = (T_MSK*)ptr_msk;                 \
                for (i=first; i<elems&&pck_idx<lim; i++) {              \
                    if (neq_zero_##AT_MSK(msk[i])) {                    \
                        assign_##AT(dst[i], pck[pck_idx]);              \
                        ++pck_idx;                                      \
                    }                                                   \
                }                                                       \
                break;                                                  \
            }
        ga_unpack_case(C_INT,int,reg,           C_INT,int,reg)
        ga_unpack_case(C_LONG,long,reg,         C_INT,int,reg)
        ga_unpack_case(C_LONGLONG,long long,reg,C_INT,int,reg)
        ga_unpack_case(C_FLOAT,float,reg,       C_INT,int,reg)
        ga_unpack_case(C_DBL,double,reg,        C_INT,int,reg)
        ga_unpack_case(C_SCPL,SingleComplex,cpl,C_INT,int,reg)
        ga_unpack_case(C_DCPL,DoubleComplex,cpl,C_INT,int,reg)
        ga_unpack_case(C_INT,int,reg,           C_LONG,long,reg)
        ga_unpack_case(C_LONG,long,reg,         C_LONG,long,reg)
        ga_unpack_case(C_LONGLONG,long long,reg,C_LONG,long,reg)
        ga_unpack_case(C_FLOAT,float,reg,       C_LONG,long,reg)
        ga_unpack_case(C_DBL,double,reg,        C_LONG,long,reg)
        ga_unpack_case(C_SCPL,SingleComplex,cpl,C_LONG,long,reg)
        ga_unpack_case(C_DCPL,DoubleComplex,cpl,C_LONG,long,reg)
        ga_unpack_case(C_INT,int,reg,           C_LONGLONG,long long,reg)
        ga_unpack_case(C_LONG,long,reg,         C_LONGLONG,long long,reg)
        ga_unpack_case(C_LONGLONG,long long,reg,C_LONGLONG,long long,reg)
        ga_unpack_case(C_FLOAT,float,reg,       C_LONGLONG,long long,reg)
        ga_unpack_case(C_DBL,double,reg,        C_LONGLONG,long long,reg)
        ga_unpack_case(C_SCPL,SingleComplex,cpl,C_LONGLONG,long long,reg)
        ga_unpack_case(C_DCPL,DoubleComplex,cpl,C_LONGLONG,long long,reg)
        ga_unpack_case(C_INT,int,reg,           C_FLOAT,float,reg)
        ga_unpack_case(C_LONG,long,reg,         C_FLOAT,float,reg)
        ga_unpack_case(C_LONGLONG,long long,reg,C_FLOAT,float,reg)
        ga_unpack_case(C_FLOAT,float,reg,       C_FLOAT,float,reg)
        ga_unpack_case(C_DBL,double,reg,        C_FLOAT,float,reg)
        ga_unpack_case(C_SCPL,SingleComplex,cpl,C_FLOAT,float,reg)
        ga_unpack_case(C_DCPL,DoubleComplex,cpl,C_FLOAT,float,reg)
        ga_unpack_case(C_INT,int,reg,           C_DBL,double,reg)
        ga_unpack_case(C_LONG,long,reg,         C_DBL,double,reg)
        ga_unpack_case(C_LONGLONG,long long,reg,C_DBL,double,reg)
        ga_unpack_case(C_FLOAT,float,reg,       C_DBL,double,reg)
        ga_unpack_case(C_DBL,double,reg,        C_DBL,double,reg)
        ga_unpack_case(C_SCPL,SingleComplex,cpl,C_DBL,double,reg)
        ga_unpack_case(C_DCPL,DoubleComplex,cpl,C_DBL,double,reg)
        ga_unpack_case(C_INT,int,reg,           C_SCPL,SingleComplex,cpl)
        ga_unpack_case(C_LONG,long,reg,         C_SCPL,SingleComplex,cpl)
        ga_unpack_case(C_LONGLONG,long long,reg,C_SCPL,SingleComplex,cpl)
        ga_unpack_case(C_FLOAT,float,reg,       C_SCPL,SingleComplex,cpl)
        ga_unpack_case(C_DBL,double,reg,        C_SCPL,SingleComplex,cpl)
        ga_unpack_case(C_SCPL,SingleComplex,cpl,C_SCPL,SingleComplex,cpl)
        ga_unpack_case(C_DCPL,DoubleComplex,cpl,C_SCPL,SingleComplex,cpl)
        ga_unpack_case(C_INT,int,reg,           C_DCPL,DoubleComplex,cpl)
        ga_unpack_case(C_LONG,long,reg,         C_DCPL,DoubleComplex,cpl)
        ga_unpack_case(C_LONGLONG,long long,reg,C_DCPL,DoubleComplex,cpl)
        ga_unpack_case(C_FLOAT,float,reg,       C_DCPL,DoubleComplex,cpl)
        ga_unpack_case(C_DBL,double,reg,        C_DCPL,DoubleComplex,cpl)
        ga_unpack_case(C_SCPL,SingleComplex,cpl,C_DCPL,DoubleComplex,cpl)
        ga_unpack_case(C_DCPL,DoubleComplex,cpl,C_DCPL,DoubleComplex,cpl)
    }
#undef ga_unpack_case
}